

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  addrinfo *paVar1;
  pollfd pVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  ssize_t sVar8;
  ostream *poVar9;
  long lVar10;
  bool bVar11;
  char local_2e8 [8];
  char userInput [256];
  char buf [256];
  char local_b8 [8];
  char s [46];
  byte local_82;
  pollfd pollData [2];
  pointer local_70;
  undefined1 local_68 [16];
  addrinfo *local_58;
  addrinfo *servinfo;
  string sUserInput;
  
  if (argc != 2) {
LAB_0010282b:
    poVar9 = std::operator<<((ostream *)&std::cerr,"usage: client hostname");
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(1);
  }
  buf[0xf8] = '\0';
  buf[0xf9] = '\0';
  buf[0xfa] = '\0';
  buf[0xfb] = '\0';
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  iVar4 = getaddrinfo(argv[1],"3491",(addrinfo *)(buf + 0xf8),&local_58);
  paVar1 = local_58;
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"getaddrinfo: ",0xd);
    pcVar6 = gai_strerror(iVar4);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106140);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    return 1;
  }
  do {
    if (paVar1 == (addrinfo *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"client: failed to connect",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      return 2;
    }
    iVar4 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
    pcVar6 = "client: socket";
    if (iVar4 != -1) {
      iVar5 = connect(iVar4,paVar1->ai_addr,paVar1->ai_addrlen);
      if (iVar5 != -1) {
        inet_ntop(paVar1->ai_family,
                  paVar1->ai_addr->sa_data + (ulong)(paVar1->ai_addr->sa_family != 2) * 4 + 2,
                  local_b8,0x2e);
        freeaddrinfo(local_58);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"My chat room server. Version Two.",0x21);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        s[0x2c] = '\x01';
        s[0x2d] = '\0';
        s._40_4_ = iVar4;
        pollData[0].fd = fileno(_stdin);
        pollData[0].events = 1;
        pcVar6 = userInput + 0xf8;
        while( true ) {
          while( true ) {
            while( true ) {
              do {
                iVar5 = poll((pollfd *)(s + 0x28),2,500);
              } while (iVar5 == 0);
              if (iVar5 != -1) break;
              perror("Polling error");
            }
            if ((local_82 & 1) != 0) break;
            sUserInput._M_dataplus._M_p = (pointer)0x0;
            sUserInput._M_string_length._0_1_ = 0;
            servinfo = (addrinfo *)&sUserInput._M_string_length;
            cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + ' ');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)&servinfo,cVar3);
            strcpy(local_2e8,(char *)servinfo);
            sVar8 = send(iVar4,local_2e8,0x100,0);
            if (sVar8 == -1) {
              perror("send");
            }
            pollData[1] = (pollfd)local_68;
            std::__cxx11::string::_M_construct<char_const*>((string *)(pollData + 1),"logout","");
            pVar2 = pollData[1];
            if (sUserInput._M_dataplus._M_p == local_70) {
              if (sUserInput._M_dataplus._M_p == (pointer)0x0) {
                bVar11 = true;
              }
              else {
                iVar5 = bcmp(servinfo,(void *)pollData[1],(size_t)sUserInput._M_dataplus._M_p);
                bVar11 = iVar5 == 0;
              }
            }
            else {
              bVar11 = false;
            }
            if (pVar2 != (pollfd)local_68) {
              operator_delete((void *)pVar2);
            }
            if ((!bVar11) &&
               (lVar10 = std::__cxx11::string::find((char *)&servinfo,0x10309f,0), lVar10 != -1)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"> ",2);
              std::ostream::flush();
            }
            if (servinfo != (addrinfo *)&sUserInput._M_string_length) {
              operator_delete(servinfo);
            }
            if (bVar11) {
              close(iVar4);
              return 0;
            }
          }
          bzero(pcVar6,0x100);
          sVar8 = recv(iVar4,pcVar6,0xff,0);
          iVar5 = (int)sVar8;
          if (iVar5 == -1) break;
          userInput[(long)iVar5 + 0xf8] = '\0';
          if (0 < iVar5) {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
            std::ostream::put(-0x40);
            poVar9 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"> ",2);
            std::ostream::flush();
          }
        }
        main_cold_1();
        goto LAB_0010282b;
      }
      close(iVar4);
      pcVar6 = "client: connect";
    }
    perror(pcVar6);
    paVar1 = paVar1->ai_next;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]){
    //lots of declaration with the socket code
    int sockfd, numbytes;
    char buf[MAXDATASIZE];
    struct addrinfo hints, *servinfo, *p;
    int rv;
    char s[INET6_ADDRSTRLEN];
    char userInput[MAXDATASIZE];
    struct pollfd pollData[2];


    if (argc != 2) {
        cerr << "usage: client hostname" << endl;
        exit(1);
    }

    memset(&hints, 0, sizeof hints);

    //Accpets both IPV4 and IPV6
    hints.ai_family = AF_UNSPEC;
    //Using the stream socket type
    hints.ai_socktype = SOCK_STREAM;

    if ((rv = getaddrinfo(argv[1], PORT, &hints, &servinfo)) != 0) {
        cerr << "getaddrinfo: " <<  gai_strerror(rv) << endl;
        return 1;
    }

    // loop through all the results and connect to the first we can
    for(p = servinfo; p != NULL; p = p->ai_next) {
        if ((sockfd = socket(p->ai_family, p->ai_socktype,
                p->ai_protocol)) == -1) {
            perror("client: socket");
            continue;
        }
        //connect to that socket
        if (connect(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
            close(sockfd);
            perror("client: connect");
            continue;
        }

        break;
    }

    if (p == NULL) {
        cerr << "client: failed to connect" << endl;
        return 2;
    }

    //Convert the binary address to string, Thanks to http://beej.us/guide/bgnet/output/html/multipage/clientserver.html
    // for the awsome function with all the bit operators, you da best
    inet_ntop(p->ai_family, get_in_addr((struct sockaddr *)p->ai_addr),
            s, sizeof s);
    //cout << "client: connecting to " <<  s << endl;

    freeaddrinfo(servinfo); // all done with this structure
    cout << "My chat room server. Version Two." << endl;




    //set everything up for stdin and sockect recv polling
    pollData[0].fd = sockfd;
    pollData[0].events = POLLIN;
    pollData[1].fd = fileno(stdin);
    pollData[1].events = POLLIN;


    while(1){

        //TODO finish polling
        rv = poll(pollData, 2, 500);

        if(rv == -1){
            perror("Polling error");
        }
        //check if there was some data recieved on stdin or the socket
        else if (rv != 0){
            //check if it was received on the socket
            if (pollData[0].revents & POLLIN) {
                bzero(buf,MAXDATASIZE);
                if ((numbytes = recv(sockfd, buf, MAXDATASIZE-1, 0)) == -1) {
                    perror("recv");
                    exit(1);
                }

                //add the nul terminator to stop the string of data
                buf[numbytes] = '\0';

                //if recieved actual data print it otherwise ignore it
                if(numbytes > 0){
                    //print out the message received from the serveer
                    cout << buf << endl << "> ";
                    //the last > gets caught if you don't flush standard out
                    cout.flush();
                }
            }
            else{
                // check if the user is typing on the command line
                string sUserInput;
                getline(cin,sUserInput);

                //copy it to a cstring
                strcpy (userInput, sUserInput.c_str());

                //send the input to the server
                if (send(sockfd, userInput, MAXDATASIZE, 0) == -1)
                    perror("send");
                //check if the user wants to log out
                if(sUserInput == string("logout")){
                    break;
                }
                //use this to fixed a missing > for the output
                else if(sUserInput.find("send") !=  string::npos){
                    cout << "> ";
                    cout.flush();
                }
            }
        }

    }

    //close the socket
    close(sockfd);

    return 0;
}